

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O3

QString * __thiscall
XmlOutput::doConversion(QString *__return_storage_ptr__,XmlOutput *this,QString *text)

{
  char16_t cVar1;
  ConverstionType CVar2;
  char16_t *pcVar3;
  Data *pDVar4;
  ulong uVar5;
  CaseSensitivity CVar6;
  int i;
  ulong uVar7;
  char *pcVar8;
  QChar QVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QArrayData *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (text->d).size;
  if (uVar5 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_00264d23;
  }
  CVar2 = this->conversion;
  if (CVar2 == NoConversion) {
    pDVar4 = (text->d).d;
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr = (text->d).ptr;
    (__return_storage_ptr__->d).size = uVar5;
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QVar9.ucs = (char16_t)__return_storage_ptr__;
    if (CVar2 == XMLConversion) {
      uVar7 = 0;
      do {
        pcVar3 = (text->d).ptr;
        cVar1 = pcVar3[uVar7];
        if (cVar1 == L'&') {
          if ((((uVar5 <= uVar7 + 7) || (pcVar3[uVar7 + 1] != L'#')) || (pcVar3[uVar7 + 2] != L'x'))
             || (pcVar3[uVar7 + 7] != L';')) {
            pcVar8 = (char *)0x5;
            goto LAB_00264c0f;
          }
LAB_00264c2c:
          QString::append(QVar9);
        }
        else {
          if (cVar1 == L'<') {
            pcVar8 = (char *)0x4;
          }
          else {
            if (cVar1 != L'>') {
              if (0x1f < (ushort)cVar1) goto LAB_00264c2c;
              QVar10.m_data = (storage_type *)0x6;
              QVar10.m_size = (qsizetype)&local_58;
              QString::fromUtf8(QVar10);
              local_78 = local_58;
              uStack_70 = uStack_50;
              local_68 = local_48;
              QString::arg_impl((ulonglong)&local_58,(int)&local_78,(uint)(ushort)cVar1,(QChar)0x2);
              QString::append((QString *)__return_storage_ptr__);
              if (local_58 != (QArrayData *)0x0) {
                LOCK();
                (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_58,2,0x10);
                }
              }
              if (local_78 != (QArrayData *)0x0) {
                LOCK();
                (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_78,2,0x10);
                }
              }
              goto LAB_00264c14;
            }
            pcVar8 = (char *)0x4;
          }
LAB_00264c0f:
          QVar11.m_data = pcVar8;
          QVar11.m_size = (qsizetype)__return_storage_ptr__;
          QString::append(QVar11);
        }
LAB_00264c14:
        uVar7 = uVar7 + 1;
        uVar5 = (text->d).size;
      } while (uVar7 < uVar5);
    }
    else {
      QString::operator=(__return_storage_ptr__,(QString *)text);
    }
    if (this->conversion == XMLConversion) {
      QVar13.m_data = (char *)0x6;
      QVar13.m_size = 0x22;
      QString::replace(QVar9,QVar13,0x2b5b9f);
      CVar6 = 0x2b5ba6;
      pcVar8 = (char *)0x6;
    }
    else {
      if (this->conversion != EscapeConversion) goto LAB_00264d01;
      QVar12.m_data = (char *)0x2;
      QVar12.m_size = 0x22;
      QString::replace(QVar9,QVar12,0x2b5d63);
      CVar6 = 0x2ad951;
      pcVar8 = (char *)0x2;
    }
    QVar14.m_data = pcVar8;
    QVar14.m_size = 0x27;
    QString::replace(QVar9,QVar14,CVar6);
  }
LAB_00264d01:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00264d23:
  __stack_chk_fail();
}

Assistant:

QString XmlOutput::doConversion(const QString &text)
{
    if (!text.size())
        return QString();
    else if (conversion == NoConversion)
        return text;

    QString output;
    if (conversion == XMLConversion) {

        // this is a way to escape characters that shouldn't be converted
        for (int i=0; i<text.size(); ++i) {
            const QChar c = text.at(i);
            if (c == QLatin1Char('&')) {
                if ( (i + 7) < text.size() &&
                    text.at(i + 1) == QLatin1Char('#') &&
                    text.at(i + 2) == QLatin1Char('x') &&
                    text.at(i + 7) == QLatin1Char(';') ) {
                    output += text.at(i);
                } else {
                    output += QLatin1String("&amp;");
                }
            } else if (c == QLatin1Char('<')) {
                output += QLatin1String("&lt;");
            } else if (c == QLatin1Char('>')) {
                output += QLatin1String("&gt;");
            } else {
                if (c.unicode() < 0x20) {
                    output += QString("&#x%1;").arg(ushort{c.unicode()}, 2, 16, QLatin1Char('0'));
                } else {
                    output += c;
                }
            }
        }
    } else {
        output = text;
    }

    if (conversion == XMLConversion) {
        output.replace('\"', QLatin1String("&quot;"));
        output.replace('\'', QLatin1String("&apos;"));
    } else if (conversion == EscapeConversion) {
        output.replace('\"', QLatin1String("\\\""));
        output.replace('\'', QLatin1String("\\\'"));
    }
    return output;
}